

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathie.cpp
# Opt level: O3

string * Pathie::filename_to_utf8(string *__return_storage_ptr__,string *native_filename)

{
  pointer pcVar1;
  int iVar2;
  char *__s1;
  
  __s1 = nl_langinfo(0xe);
  iVar2 = strcmp(__s1,"UTF-8");
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (native_filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + native_filename->_M_string_length);
  }
  else {
    convert_encodings(__return_storage_ptr__,__s1,"UTF-8",native_filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pathie::filename_to_utf8(const std::string& native_filename)
{
  bool fs_encoding_is_utf8 = false;
  char* fsencoding = NULL;

#if defined(__APPLE__) || defined(PATHIE_ASSUME_UTF8_ON_UNIX)
  fs_encoding_is_utf8 = true;
#else
  fsencoding = nl_langinfo(CODESET);
  fs_encoding_is_utf8 = (strcmp(fsencoding, "UTF-8") == 0);
#endif

  // Skip the expensive convert_encodings() call if the filesystem
  // encoding already is UTF-8.
  if (fs_encoding_is_utf8) {
    return std::string(native_filename);
  }

  return convert_encodings(fsencoding, "UTF-8", native_filename);
}